

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O1

void __thiscall
ThreadParser::SAXHandler::startElement(SAXHandler *this,XMLCh *name,AttributeList *attributes)

{
  XMLCh XVar1;
  long lVar2;
  ushort *puVar3;
  int iVar4;
  ushort uVar5;
  XMLCh *pXVar6;
  long lVar7;
  
  XVar1 = *name;
  if (XVar1 != L'\0') {
    iVar4 = this->SAXInstance->fCheckSum;
    pXVar6 = name + 1;
    do {
      iVar4 = iVar4 * 5 + (uint)(ushort)XVar1;
      XVar1 = *pXVar6;
      pXVar6 = pXVar6 + 1;
    } while (XVar1 != L'\0');
    this->SAXInstance->fCheckSum = iVar4;
  }
  lVar2 = (**(code **)(*(long *)attributes + 0x10))(attributes);
  if (lVar2 != 0) {
    lVar7 = 0;
    do {
      puVar3 = (ushort *)(**(code **)(*(long *)attributes + 0x18))(attributes,lVar7);
      uVar5 = *puVar3;
      if (uVar5 != 0) {
        iVar4 = this->SAXInstance->fCheckSum;
        do {
          puVar3 = puVar3 + 1;
          iVar4 = iVar4 * 5 + (uint)uVar5;
          uVar5 = *puVar3;
        } while (uVar5 != 0);
        this->SAXInstance->fCheckSum = iVar4;
      }
      puVar3 = (ushort *)(**(code **)(*(long *)attributes + 0x28))(attributes,lVar7);
      uVar5 = *puVar3;
      if (uVar5 != 0) {
        iVar4 = this->SAXInstance->fCheckSum;
        do {
          puVar3 = puVar3 + 1;
          iVar4 = iVar4 * 5 + (uint)uVar5;
          uVar5 = *puVar3;
        } while (uVar5 != 0);
        this->SAXInstance->fCheckSum = iVar4;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar2);
  }
  return;
}

Assistant:

void ThreadParser::SAXHandler::startElement(const XMLCh *const name, AttributeList &attributes)
{
    SAXInstance->addToCheckSum(name);
    XMLSize_t n = attributes.getLength();
    XMLSize_t i;
    for (i=0; i<n; i++)
    {
        const XMLCh *attNam = attributes.getName(i);
        SAXInstance->addToCheckSum(attNam);
        const XMLCh *attVal = attributes.getValue(i);
        SAXInstance->addToCheckSum(attVal);
    }
}